

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d1_both.cc
# Opt level: O3

int bssl::dtls1_flush(SSL *ssl)

{
  long lVar1;
  byte bVar2;
  char *pcVar3;
  DTLSSentRecord t;
  bool bVar4;
  uint16_t uVar5;
  int iVar6;
  int iVar7;
  ulong uVar8;
  DTLSRecordNumber *pDVar9;
  uchar *puVar10;
  size_t sVar11;
  size_t sVar12;
  uint8_t *puVar13;
  pointer __p_00;
  DTLS1_STATE *pDVar14;
  byte bVar15;
  ushort uVar16;
  byte bVar17;
  ulong uVar18;
  long lVar19;
  ulong uVar20;
  MRUQueue<bssl::DTLSSentRecord,_32UL> *this;
  size_t in_R9;
  char *pcVar21;
  uint uVar22;
  pointer __p;
  long lVar23;
  ulong uVar24;
  Span<const_unsigned_char> in;
  Span<const_unsigned_char> in_00;
  Span<const_unsigned_char> in_01;
  Range RVar25;
  OPENSSL_timeval now;
  size_t local_670;
  uint8_t *local_668;
  size_t local_658;
  uint32_t local_64c;
  Array<unsigned_char> local_648;
  uint8_t *local_638;
  size_t local_630;
  size_t record_len;
  ulong local_620;
  uint8_t *local_618;
  long local_610;
  DTLSMessageBitmap *local_608;
  ulong local_600;
  long local_5f8;
  CBB cbb;
  CBB child;
  DTLSRecordNumber local_590;
  uint8_t auStack_588 [2];
  undefined2 uStack_586;
  uint32_t uStack_584;
  uint32_t local_580;
  undefined4 uStack_57c;
  byte local_490;
  uint8_t record [584];
  uint8_t buf [514];
  
  pDVar14 = ssl->d1;
  uVar16 = *(ushort *)pDVar14;
  if ((uVar16 & 0x40) != 0) {
    uVar5 = ssl_protocol_version(ssl);
    if (uVar5 < 0x304) {
      __assert_fail("ssl_protocol_version(ssl) >= TLS1_3_VERSION",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/d1_both.cc"
                    ,0x3c2,"int bssl::send_ack(SSL *)");
    }
    dtls1_update_mtu(ssl);
    sVar12 = dtls_seal_max_input_len
                       (ssl,*(uint16_t *)((long)&(ssl->d1->write_epoch).next_record.combined_ + 6),
                        (ulong)ssl->d1->mtu);
    if (sVar12 < 0x12) {
      iVar6 = 0xa9;
      iVar7 = 0x3ca;
      goto LAB_0016f8d5;
    }
    uVar8 = sVar12 - 2 >> 4;
    pDVar14 = ssl->d1;
    uVar20 = (ulong)(pDVar14->records_to_ack).storage_.size_;
    local_490 = 0;
    uVar18 = 0;
    if (uVar8 <= uVar20) {
      uVar18 = uVar20 - uVar8;
    }
    if (uVar18 < uVar20) {
      lVar19 = 0;
      uVar8 = 0;
      do {
        lVar23 = lVar19;
        pDVar9 = MRUQueue<bssl::DTLSRecordNumber,_32UL>::operator[]
                           (&pDVar14->records_to_ack,uVar18 + uVar8);
        if (0x1f < uVar8) {
          abort();
        }
        *(uint64_t *)(auStack_588 + uVar8 * 8 + -8) = pDVar9->combined_;
        uVar20 = uVar8 + 1;
        local_490 = (byte)uVar20;
        pDVar14 = ssl->d1;
        lVar1 = uVar18 + uVar8;
        lVar19 = lVar23 + 8;
        uVar8 = uVar20;
      } while (lVar1 + 1U < (ulong)(pDVar14->records_to_ack).storage_.size_);
      lVar19 = 0x3f;
      if (uVar20 != 0) {
        for (; uVar20 >> lVar19 == 0; lVar19 = lVar19 + -1) {
        }
      }
      std::__introsort_loop<bssl::DTLSRecordNumber*,long,__gnu_cxx::__ops::_Iter_less_iter>
                (&local_590,auStack_588 + lVar23,((uint)lVar19 ^ 0x3f) * 2 ^ 0x7e);
      std::__final_insertion_sort<bssl::DTLSRecordNumber*,__gnu_cxx::__ops::_Iter_less_iter>
                (&local_590,auStack_588 + lVar23);
    }
    CBB_init_fixed(&cbb,buf,0x202);
    iVar6 = CBB_add_u16_length_prefixed(&cbb,&child);
    if (iVar6 == 0) {
      abort();
    }
    if (local_490 != 0) {
      uVar18 = (ulong)local_490;
      lVar19 = 0;
      do {
        iVar6 = CBB_add_u64(&child,(ulong)*(ushort *)(auStack_588 + lVar19 + -2));
        if (iVar6 == 0) {
          abort();
        }
        iVar6 = CBB_add_u64(&child,*(ulong *)(auStack_588 + lVar19 + -8) & 0xffffffffffff);
        if (iVar6 == 0) {
          abort();
        }
        lVar19 = lVar19 + 8;
      } while (uVar18 * 8 != lVar19);
    }
    iVar6 = CBB_flush(&cbb);
    if (iVar6 == 0) {
      abort();
    }
    local_648.data_ = (uchar *)0x0;
    puVar13 = CBB_data(&cbb);
    sVar12 = CBB_len(&cbb);
    in_R9 = 0x1a;
    bVar4 = dtls_seal_record(ssl,(DTLSRecordNumber *)&local_648,record,&record_len,0x248,'\x1a',
                             puVar13,sVar12,
                             *(uint16_t *)((long)&(ssl->d1->write_epoch).next_record.combined_ + 6))
    ;
    if (!bVar4) {
      return -1;
    }
    puVar13 = CBB_data(&cbb);
    puVar10 = (uchar *)CBB_len(&cbb);
    in.size_ = in_R9;
    in.data_ = puVar10;
    ssl_do_msg_callback((bssl *)ssl,(SSL *)0x1,0x1a,(int)puVar13,in);
    iVar6 = BIO_write((BIO *)(ssl->wbio)._M_t.super___uniq_ptr_impl<bio_st,_bssl::internal::Deleter>
                             ._M_t.super__Tuple_impl<0UL,_bio_st_*,_bssl::internal::Deleter>.
                             super__Head_base<0UL,_bio_st_*,_false>._M_head_impl,record,
                      (int)record_len);
    if (iVar6 < 1) {
LAB_00170382:
      ssl->s3->rwstate = 3;
      return iVar6;
    }
    iVar6 = BIO_flush((ssl->wbio)._M_t.super___uniq_ptr_impl<bio_st,_bssl::internal::Deleter>._M_t.
                      super__Tuple_impl<0UL,_bio_st_*,_bssl::internal::Deleter>.
                      super__Head_base<0UL,_bio_st_*,_false>._M_head_impl);
    if (iVar6 < 1) {
      iVar6 = -1;
      goto LAB_00170382;
    }
    *(ushort *)ssl->d1 = *(ushort *)ssl->d1 & 0xffbf;
    pDVar14 = ssl->d1;
    uVar16 = *(ushort *)pDVar14;
  }
  if ((uVar16 & 0x20) == 0) {
    return 1;
  }
  if (ssl->s3->write_shutdown == ssl_shutdown_none) {
    if ((ssl->wbio)._M_t.super___uniq_ptr_impl<bio_st,_bssl::internal::Deleter>._M_t.
        super__Tuple_impl<0UL,_bio_st_*,_bssl::internal::Deleter>.
        super__Head_base<0UL,_bio_st_*,_false>._M_head_impl == (bio_st *)0x0) {
      iVar6 = 0x77;
      iVar7 = 0x36e;
    }
    else {
      if (pDVar14->num_timeouts < 0xd) {
        dtls1_update_mtu(ssl);
        local_648.data_ = (uint8_t *)0x0;
        local_648.size_ = 0;
        bVar4 = Array<unsigned_char>::InitUninitialized(&local_648,(ulong)ssl->d1->mtu);
        iVar6 = -1;
        if (bVar4) {
          pDVar14 = ssl->d1;
          bVar17 = pDVar14->outgoing_written;
          if (bVar17 < (pDVar14->outgoing_messages).size_) {
LAB_0016fbce:
            local_64c = pDVar14->outgoing_offset;
            local_668 = local_648.data_;
            local_670 = local_648.size_;
            lVar19 = 0;
LAB_0016fbf2:
            local_658 = 0;
            bVar15 = (pDVar14->outgoing_messages).size_;
            bVar2 = pDVar14->outgoing_written;
            uVar18 = (ulong)bVar2;
            iVar6 = 2;
            local_5f8 = lVar19;
            if (bVar2 < bVar15) {
              pcVar21 = (pDVar14->outgoing_messages).storage_ + (ulong)((uint)bVar2 * 0x30) + 0x10;
              do {
                if ((pcVar21[2] != '\0') || (*(long *)(pcVar21 + 0x10) != 0)) {
                  sVar11 = dtls_seal_prefix_len(ssl,*(uint16_t *)pcVar21);
                  sVar12 = dtls_seal_max_input_len(ssl,*(uint16_t *)pcVar21,local_670);
                  if (sVar12 != 0) {
                    if (pcVar21[2] == '\x01') {
                      record[0] = '\0';
                      record[1] = '\0';
                      record[2] = '\0';
                      record[3] = '\0';
                      record[4] = '\0';
                      record[5] = '\0';
                      record[6] = '\0';
                      record[7] = '\0';
                      in_R9 = 0x14;
                      bVar4 = dtls_seal_record(ssl,(DTLSRecordNumber *)record,local_668,&local_658,
                                               local_670,'\x14',
                                               "\x01/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/d1_both.cc"
                                               ,1,*(uint16_t *)pcVar21);
                      iVar6 = 0;
                      if (bVar4) {
                        in_00.size_ = in_R9;
                        in_00.data_ = (uchar *)0x1;
                        ssl_do_msg_callback((bssl *)ssl,(SSL *)0x1,0x14,0x234714,in_00);
                        pDVar14 = ssl->d1;
                        pDVar14->outgoing_offset = 0;
                        puVar13 = &pDVar14->outgoing_written;
                        *puVar13 = *puVar13 + '\x01';
                        iVar6 = 1;
                      }
                      goto LAB_00170264;
                    }
                    if (local_670 < sVar11) {
                      abort();
                    }
                    uVar5 = *(uint16_t *)pcVar21;
                    local_618 = local_668 + sVar11;
                    if (local_670 - sVar11 < sVar12) {
                      sVar12 = local_670 - sVar11;
                    }
                    CBB_init_fixed((CBB *)record,local_618,sVar12);
                    local_590.combined_ = 0;
                    auStack_588[0] = ssl->d1->outgoing_written;
                    uStack_584 = ssl->d1->outgoing_offset;
                    local_630 = sVar12;
                    goto LAB_0016fd9c;
                  }
                  break;
                }
                pDVar14->outgoing_offset = 0;
                uVar18 = uVar18 + 1;
                pDVar14->outgoing_written = (uint8_t)uVar18;
                pcVar21 = pcVar21 + 0x30;
              } while (bVar15 != uVar18);
            }
            goto LAB_0017026d;
          }
LAB_001702ef:
          iVar7 = BIO_flush((ssl->wbio)._M_t.super___uniq_ptr_impl<bio_st,_bssl::internal::Deleter>.
                            _M_t.super__Tuple_impl<0UL,_bio_st_*,_bssl::internal::Deleter>.
                            super__Head_base<0UL,_bio_st_*,_false>._M_head_impl);
          iVar6 = 1;
          if (iVar7 < 1) {
            ssl->s3->rwstate = 3;
LAB_0017030f:
            iVar6 = -1;
          }
        }
LAB_00170314:
        OPENSSL_free(local_648.data_);
        if (iVar6 < 1) {
          return iVar6;
        }
        pDVar14 = ssl->d1;
        pDVar14->outgoing_written = '\0';
        pDVar14->outgoing_offset = 0;
        *(byte *)pDVar14 = *(byte *)pDVar14 & 0xdf;
        iVar6 = SSL_in_init(ssl);
        if ((iVar6 == 0) && (uVar5 = ssl_protocol_version(ssl), uVar5 < 0x304)) {
          return 1;
        }
        pDVar14 = ssl->d1;
        if (pDVar14->num_timeouts == 0) {
          uVar22 = ssl->initial_timeout_duration_ms;
        }
        else {
          uVar22 = pDVar14->timeout_duration_ms * 2;
          if (59999 < uVar22) {
            uVar22 = 60000;
          }
        }
        pDVar14->timeout_duration_ms = uVar22;
        now = ssl_ctx_get_current_time
                        ((ssl->ctx)._M_t.super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>.
                         _M_t.super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                         super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl);
        DTLSTimer::StartMicroseconds
                  (&ssl->d1->retransmit_timer,now,(ulong)ssl->d1->timeout_duration_ms * 1000);
        return 1;
      }
      iVar6 = 0xc6;
      iVar7 = 0x373;
    }
  }
  else {
    iVar6 = 0xc2;
    iVar7 = 0x369;
  }
LAB_0016f8d5:
  ERR_put_error(0x10,0,iVar6,
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/d1_both.cc"
                ,iVar7);
  return -1;
LAB_0016fd9c:
  do {
    pDVar14 = ssl->d1;
    if ((pDVar14->outgoing_messages).size_ <= pDVar14->outgoing_written) {
      iVar7 = 0;
      goto LAB_001700fb;
    }
    uVar18 = (ulong)((uint)pDVar14->outgoing_written * 0x30);
    iVar7 = 1;
    if ((*(uint16_t *)((pDVar14->outgoing_messages).storage_ + uVar18 + 0x10) !=
         *(uint16_t *)pcVar21) || ((pDVar14->outgoing_messages).storage_[uVar18 + 0x12] != '\0'))
    goto LAB_001700fb;
    child.child = *(CBB **)((pDVar14->outgoing_messages).storage_ + uVar18);
    pcVar3 = (pDVar14->outgoing_messages).storage_ + uVar18 + 8;
    child.is_child = pcVar3[0];
    child._9_1_ = pcVar3[1];
    child._10_1_ = pcVar3[2];
    child._11_1_ = pcVar3[3];
    child._12_1_ = pcVar3[4];
    child._13_1_ = pcVar3[5];
    child._14_1_ = pcVar3[6];
    child._15_1_ = pcVar3[7];
    bVar4 = dtls1_parse_fragment((CBS *)&child,(hm_header_st *)&cbb,(CBS *)&record_len);
    if ((!bVar4 || cbb._12_4_ != 0) ||
       (((local_620 != (uint)cbb.u._0_4_ || (cbb.u._0_4_ != cbb.child._4_4_)) || (child._8_8_ != 0))
       )) {
      ERR_put_error(0x10,0,0x44,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/d1_both.cc"
                    ,0x2ec);
      goto LAB_001700e3;
    }
    local_610 = CONCAT44(record_len._4_4_,(int)record_len);
    local_608 = (DTLSMessageBitmap *)((pDVar14->outgoing_messages).storage_ + uVar18 + 0x18);
    local_600 = (ulong)(uint)cbb.u._0_4_;
    RVar25 = DTLSMessageBitmap::NextUnmarkedRange(local_608,(ulong)ssl->d1->outgoing_offset);
    if (RVar25.start != RVar25.end) {
      do {
        uVar18 = RVar25.start;
        sVar12 = CBB_len((CBB *)record);
        if (local_630 - sVar12 < 0xd) {
          iVar7 = 0;
          goto LAB_001700fb;
        }
        uVar24 = RVar25.end - uVar18;
        uVar20 = (local_630 - sVar12) - 0xc;
        uVar8 = uVar24;
        if (uVar20 < uVar24) {
          uVar8 = uVar20;
        }
        if ((int)local_600 == 0) {
          local_638 = (uint8_t *)0x0;
          sVar12 = 0;
        }
        else {
          if (local_600 < uVar18) {
            abort();
          }
          local_638 = (uint8_t *)(local_610 + uVar18);
          sVar12 = local_600 - uVar18;
          if (uVar8 <= local_600 - uVar18) {
            sVar12 = uVar8;
          }
        }
        sVar11 = CBB_len((CBB *)record);
        iVar6 = CBB_add_u8((CBB *)record,(uint8_t)cbb.child);
        if (((iVar6 == 0) || (iVar6 = CBB_add_u24((CBB *)record,cbb.child._4_4_), iVar6 == 0)) ||
           (iVar6 = CBB_add_u16((CBB *)record,cbb._8_2_), iVar6 == 0)) {
LAB_00170079:
          iVar6 = 1;
          ERR_put_error(0x10,0,0x44,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/d1_both.cc"
                        ,0x313);
          goto LAB_0017009c;
        }
        iVar6 = CBB_add_u24((CBB *)record,(uint32_t)RVar25.start);
        if (((iVar6 == 0) ||
            (iVar6 = CBB_add_u24_length_prefixed((CBB *)record,(CBB *)buf), iVar6 == 0)) ||
           ((iVar6 = CBB_add_bytes((CBB *)buf,local_638,sVar12), iVar6 == 0 ||
            (iVar6 = CBB_flush((CBB *)record), iVar6 == 0)))) goto LAB_00170079;
        sVar12 = CBB_len((CBB *)record);
        if (local_630 < sVar11) {
          abort();
        }
        puVar10 = (uchar *)(sVar12 - sVar11);
        if ((uchar *)(local_630 - sVar11) < (uchar *)(sVar12 - sVar11)) {
          puVar10 = (uchar *)(local_630 - sVar11);
        }
        in_01.size_ = in_R9;
        in_01.data_ = puVar10;
        ssl_do_msg_callback((bssl *)ssl,(SSL *)0x1,0x16,(int)sVar11 + (int)local_618,in_01);
        uVar22 = (int)uVar8 + (uint32_t)RVar25.start;
        ssl->d1->outgoing_offset = uVar22;
        if (uVar20 < uVar24) {
          iVar6 = 8;
          goto LAB_0017009c;
        }
        RVar25 = DTLSMessageBitmap::NextUnmarkedRange(local_608,(ulong)uVar22);
      } while (RVar25.start != RVar25.end);
    }
    pDVar14 = ssl->d1;
    puVar13 = &pDVar14->outgoing_written;
    *puVar13 = *puVar13 + '\x01';
    iVar6 = 0;
    pDVar14->outgoing_offset = 0;
    if (uVar5 == 0) {
      iVar7 = 1;
      goto LAB_001700fb;
    }
LAB_0017009c:
  } while (iVar6 == 0);
  iVar7 = 0;
  if ((iVar6 == 8) || (iVar7 = 0, iVar6 == 5)) {
LAB_001700fb:
    auStack_588[1] = ssl->d1->outgoing_written;
    local_580 = ssl->d1->outgoing_offset;
    sVar12 = CBB_len((CBB *)record);
    if (sVar12 == 0) {
      iVar6 = 2;
      if ((char)iVar7 != '\0') {
        __assert_fail("!should_continue",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/d1_both.cc"
                      ,0x331,"seal_result_t bssl::seal_next_record(SSL *, Span<uint8_t>, size_t *)")
        ;
      }
    }
    else {
      puVar13 = CBB_data((CBB *)record);
      sVar12 = CBB_len((CBB *)record);
      in_R9 = 0x16;
      bVar4 = dtls_seal_record(ssl,&local_590,local_668,&local_658,local_670,'\x16',puVar13,sVar12,
                               *(uint16_t *)pcVar21);
      iVar6 = 0;
      if (bVar4) {
        if ((ssl->s3->version == 0) || (uVar5 = ssl_protocol_version(ssl), 0x303 < uVar5)) {
          this = (ssl->d1->sent_records)._M_t.
                 super___uniq_ptr_impl<bssl::MRUQueue<bssl::DTLSSentRecord,_32UL>,_bssl::internal::Deleter>
                 ._M_t.
                 super__Tuple_impl<0UL,_bssl::MRUQueue<bssl::DTLSSentRecord,_32UL>_*,_bssl::internal::Deleter>
                 .super__Head_base<0UL,_bssl::MRUQueue<bssl::DTLSSentRecord,_32UL>_*,_false>.
                 _M_head_impl;
          if (this == (MRUQueue<bssl::DTLSSentRecord,_32UL> *)0x0) {
            __p_00 = (pointer)OPENSSL_malloc(0x310);
            if (__p_00 != (pointer)0x0) {
              memset(__p_00,0,0x310);
            }
            buf[0] = '\0';
            buf[1] = '\0';
            buf[2] = '\0';
            buf[3] = '\0';
            buf[4] = '\0';
            buf[5] = '\0';
            buf[6] = '\0';
            buf[7] = '\0';
            std::
            __uniq_ptr_impl<bssl::MRUQueue<bssl::DTLSSentRecord,_32UL>,_bssl::internal::Deleter>::
            reset((__uniq_ptr_impl<bssl::MRUQueue<bssl::DTLSSentRecord,_32UL>,_bssl::internal::Deleter>
                   *)&ssl->d1->sent_records,__p_00);
            std::unique_ptr<bssl::MRUQueue<bssl::DTLSSentRecord,_32UL>,_bssl::internal::Deleter>::
            ~unique_ptr((unique_ptr<bssl::MRUQueue<bssl::DTLSSentRecord,_32UL>,_bssl::internal::Deleter>
                         *)buf);
            this = (ssl->d1->sent_records)._M_t.
                   super___uniq_ptr_impl<bssl::MRUQueue<bssl::DTLSSentRecord,_32UL>,_bssl::internal::Deleter>
                   ._M_t.
                   super__Tuple_impl<0UL,_bssl::MRUQueue<bssl::DTLSSentRecord,_32UL>_*,_bssl::internal::Deleter>
                   .super__Head_base<0UL,_bssl::MRUQueue<bssl::DTLSSentRecord,_32UL>_*,_false>.
                   _M_head_impl;
            if (this == (MRUQueue<bssl::DTLSSentRecord,_32UL> *)0x0) goto LAB_00170264;
          }
          t.last_msg = auStack_588[1];
          t.first_msg = auStack_588[0];
          t._10_2_ = uStack_586;
          t.first_msg_start = uStack_584;
          t.number.combined_ = local_590.combined_;
          t.last_msg_end._0_2_ = (short)local_580;
          t._18_6_ = (int6)(CONCAT44(uStack_57c,local_580) >> 0x10);
          MRUQueue<bssl::DTLSSentRecord,_32UL>::PushBack(this,t);
        }
        iVar6 = 2 - iVar7;
      }
    }
  }
  else {
LAB_001700e3:
    iVar6 = 0;
  }
LAB_00170264:
  if (iVar6 == 0) goto LAB_0017030f;
LAB_0017026d:
  bVar4 = local_670 < local_658;
  local_670 = local_670 - local_658;
  if (bVar4) {
    abort();
  }
  lVar19 = local_5f8 + local_658;
  if (iVar6 == 2) goto LAB_0017029c;
  local_668 = local_668 + local_658;
  pDVar14 = ssl->d1;
  goto LAB_0016fbf2;
LAB_0017029c:
  if (lVar19 == 0) {
    pDVar14 = ssl->d1;
    bVar15 = (pDVar14->outgoing_messages).size_;
    bVar17 = pDVar14->outgoing_written;
    if (bVar17 < bVar15) {
      iVar6 = 0;
      ERR_put_error(0x10,0,0xa9,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/d1_both.cc"
                    ,0x38b);
      goto LAB_00170314;
    }
  }
  else {
    iVar6 = BIO_write((BIO *)(ssl->wbio)._M_t.super___uniq_ptr_impl<bio_st,_bssl::internal::Deleter>
                             ._M_t.super__Tuple_impl<0UL,_bio_st_*,_bssl::internal::Deleter>.
                             super__Head_base<0UL,_bio_st_*,_false>._M_head_impl,local_648.data_,
                      (int)lVar19);
    pDVar14 = ssl->d1;
    if (iVar6 < 1) {
      pDVar14->outgoing_written = bVar17;
      pDVar14->outgoing_offset = local_64c;
      ssl->s3->rwstate = 3;
      goto LAB_00170314;
    }
    bVar15 = (pDVar14->outgoing_messages).size_;
    bVar17 = pDVar14->outgoing_written;
  }
  if (bVar15 <= bVar17) goto LAB_001702ef;
  goto LAB_0016fbce;
}

Assistant:

int dtls1_flush(SSL *ssl) {
  // Send the pending ACK, if any.
  if (ssl->d1->sending_ack) {
    int ret = send_ack(ssl);
    if (ret <= 0) {
      return ret;
    }
    ssl->d1->sending_ack = false;
  }

  // Send the pending flight, if any.
  if (ssl->d1->sending_flight) {
    int ret = send_flight(ssl);
    if (ret <= 0) {
      return ret;
    }

    // Reset state for the next send.
    ssl->d1->outgoing_written = 0;
    ssl->d1->outgoing_offset = 0;
    ssl->d1->sending_flight = false;

    // Schedule the next retransmit timer. In DTLS 1.3, we retransmit all
    // flights until ACKed. In DTLS 1.2, the final Finished flight is never
    // ACKed, so we do not keep the timer running after the handshake.
    if (SSL_in_init(ssl) || ssl_protocol_version(ssl) >= TLS1_3_VERSION) {
      if (ssl->d1->num_timeouts == 0) {
        ssl->d1->timeout_duration_ms = ssl->initial_timeout_duration_ms;
      } else {
        ssl->d1->timeout_duration_ms =
            std::min(ssl->d1->timeout_duration_ms * 2, uint32_t{60000});
      }

      OPENSSL_timeval now = ssl_ctx_get_current_time(ssl->ctx.get());
      ssl->d1->retransmit_timer.StartMicroseconds(
          now, uint64_t{ssl->d1->timeout_duration_ms} * 1000);
    }
  }

  return 1;
}